

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>
          (detail *this,basic_appender<char> out,unsigned___int128 value,uint prefix,
          format_specs *specs,digit_grouping<char> *grouping)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  char *digits;
  char *pcVar7;
  basic_appender<char> bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  undefined4 in_register_00000014;
  char cVar13;
  byte *pbVar14;
  int iVar15;
  undefined8 *in_R9;
  int iVar16;
  ulong size;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  format_decimal_result<char_*> fVar20;
  char buffer_1 [39];
  memory_buffer buffer;
  undefined1 in_stack_fffffffffffffd08 [12];
  anon_class_24_3_e2c60416 local_2d8;
  undefined3 uStack_2c0;
  undefined4 uStack_2bd;
  undefined1 uStack_2b9;
  undefined1 uStack_2b8;
  undefined2 uStack_2b7;
  undefined4 uStack_2b5;
  undefined4 uStack_2b1;
  memory_buffer local_248;
  
  uVar11 = CONCAT44(in_register_00000014,prefix);
  uVar5 = (uint)specs;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>.grow_ = basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
  ;
  local_248.super_buffer<char>.capacity_ = 500;
  switch((char)(grouping->grouping_)._M_string_length) {
  case '\0':
  case '\x03':
    n._12_4_ = uVar5;
    n._0_12_ = in_stack_fffffffffffffd08;
    uVar4 = count_digits_fallback<unsigned__int128>((detail *)out.buffer_,(unsigned___int128)n);
    size = (ulong)uVar4;
    local_2d8.buffer = (memory_buffer *)0x0;
    uStack_2c0 = 0;
    uStack_2bd = 0;
    local_2d8.prefix = (uint *)0x0;
    local_2d8.grouping = (digit_grouping<char> *)0x0;
    uStack_2b9 = 0;
    uStack_2b8 = 0;
    uStack_2b7 = 0;
    uStack_2b5 = 0;
    value_00._12_4_ = uVar5;
    value_00._0_12_ = in_stack_fffffffffffffd08;
    fVar20 = format_decimal<char,unsigned__int128>
                       ((detail *)&local_2d8,(char *)out.buffer_,(unsigned___int128)value_00,prefix)
    ;
    copy_noinline<char,char*,fmt::v11::basic_appender<char>>
              ((char *)&local_2d8,fVar20.end,&local_248.super_buffer<char>);
    break;
  default:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/format.h"
                ,0x80e,"");
  case '\x04':
    uVar1 = *(ushort *)((long)&(grouping->grouping_)._M_string_length + 1);
    cVar13 = (char)uVar1;
    if ((uVar1 >> 8 & 1) != 0) {
      uVar9 = (uint)(-1 < cVar13) << 0xd | 0x5830;
      uVar4 = uVar9 << 8;
      if (uVar5 == 0) {
        uVar4 = uVar9;
      }
      uVar5 = (uVar4 | uVar5) + 0x2000000;
    }
    uVar10 = uVar11;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar17 = size;
      uVar2 = uVar10 << 0x3c;
      size = uVar17 + 1;
      bVar18 = (buffer<char> *)0xf < bVar8.buffer_;
      bVar19 = uVar10 != 0;
      uVar3 = -uVar10;
      uVar10 = uVar10 >> 4;
      bVar8.buffer_ = (buffer<char> *)(uVar2 | (ulong)bVar8.buffer_ >> 4);
    } while (bVar19 || uVar3 < bVar18);
    if (499 < (uint)uVar17) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    if ((local_248.super_buffer<char>.capacity_ < size) ||
       (local_248.super_buffer<char>.size_ = size, local_248.super_buffer<char>.ptr_ == (char *)0x0)
       ) {
      pcVar7 = (char *)((long)&local_2d8.prefix + uVar17);
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      uStack_2b8 = 0;
      pcVar12 = "0123456789ABCDEF";
      if (-1 < cVar13) {
        pcVar12 = "0123456789abcdef";
      }
      do {
        *pcVar7 = pcVar12[(uint)out.buffer_ & 0xf];
        uVar10 = uVar11 << 0x3c;
        pcVar7 = pcVar7 + -1;
        bVar18 = (buffer<char> *)0xf < out.buffer_;
        bVar19 = uVar11 != 0;
        uVar2 = -uVar11;
        uVar11 = uVar11 >> 4;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 4);
      } while (bVar19 || uVar2 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = "0123456789ABCDEF";
      if (-1 < cVar13) {
        pcVar7 = "0123456789abcdef";
      }
      pcVar12 = local_248.super_buffer<char>.ptr_ + size;
      do {
        pcVar12 = pcVar12 + -1;
        uVar10 = uVar11 << 0x3c;
        *pcVar12 = pcVar7[(uint)out.buffer_ & 0xf];
        bVar18 = (out.buffer_ < (buffer<char> *)0x10) <= uVar11;
        uVar11 = uVar11 >> 4;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 4);
      } while (bVar18);
    }
    break;
  case '\x05':
    uVar10 = uVar11;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar17 = size;
      uVar2 = uVar10 << 0x3d;
      size = uVar17 + 1;
      bVar18 = (buffer<char> *)0x7 < bVar8.buffer_;
      bVar19 = uVar10 != 0;
      uVar3 = -uVar10;
      uVar10 = uVar10 >> 3;
      bVar8.buffer_ = (buffer<char> *)(uVar2 | (ulong)bVar8.buffer_ >> 3);
    } while (bVar19 || uVar3 < bVar18);
    if ((((grouping->grouping_)._M_string_length & 0x10000) != 0) &&
       ((out.buffer_ != (buffer<char> *)0x0 || uVar11 != 0) &&
        *(int *)((long)&(grouping->grouping_)._M_dataplus._M_p + 4) <= (int)size)) {
      uVar4 = 0x3000;
      if (uVar5 == 0) {
        uVar4 = 0x30;
      }
      uVar5 = (uVar4 | uVar5) + 0x1000000;
    }
    if (499 < (uint)uVar17) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    if ((local_248.super_buffer<char>.capacity_ < size) ||
       (local_248.super_buffer<char>.size_ = size, local_248.super_buffer<char>.ptr_ == (char *)0x0)
       ) {
      pbVar14 = (byte *)((long)&local_2d8.prefix + uVar17);
      uStack_2b8 = 0;
      uStack_2b7 = 0;
      uStack_2b5 = 0;
      uStack_2b1 = 0;
      local_2d8.buffer = (memory_buffer *)0x0;
      uStack_2c0 = 0;
      uStack_2bd = 0;
      uStack_2b9 = 0;
      local_2d8.prefix = (uint *)0x0;
      local_2d8.grouping = (digit_grouping<char> *)0x0;
      do {
        *pbVar14 = (byte)out.buffer_ & 7 | 0x30;
        uVar10 = uVar11 << 0x3d;
        pbVar14 = pbVar14 + -1;
        bVar18 = (buffer<char> *)0x7 < out.buffer_;
        bVar19 = uVar11 != 0;
        uVar2 = -uVar11;
        uVar11 = uVar11 >> 3;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 3);
      } while (bVar19 || uVar2 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = local_248.super_buffer<char>.ptr_ + size;
      do {
        pcVar7 = pcVar7 + -1;
        uVar10 = uVar11 << 0x3d;
        *pcVar7 = (byte)out.buffer_ & 7 | 0x30;
        bVar18 = (out.buffer_ < (buffer<char> *)0x8) <= uVar11;
        uVar11 = uVar11 >> 3;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 3);
      } while (bVar18);
    }
    break;
  case '\x06':
    uVar1 = *(ushort *)((long)&(grouping->grouping_)._M_string_length + 1);
    if ((uVar1 >> 8 & 1) != 0) {
      uVar9 = (uint)(-1 < (char)uVar1) << 0xd | 0x4230;
      uVar4 = uVar9 << 8;
      if (uVar5 == 0) {
        uVar4 = uVar9;
      }
      uVar5 = (uVar4 | uVar5) + 0x2000000;
    }
    uVar10 = uVar11;
    bVar8.buffer_ = out.buffer_;
    size = 0;
    do {
      uVar17 = size;
      uVar2 = uVar10 << 0x3f;
      size = uVar17 + 1;
      bVar18 = (buffer<char> *)0x1 < bVar8.buffer_;
      bVar19 = uVar10 != 0;
      uVar3 = -uVar10;
      uVar10 = uVar10 >> 1;
      bVar8.buffer_ = (buffer<char> *)(uVar2 | (ulong)bVar8.buffer_ >> 1);
    } while (bVar19 || uVar3 < bVar18);
    if (499 < (uint)uVar17) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
                (&local_248.super_buffer<char>,size);
    }
    if ((local_248.super_buffer<char>.capacity_ < size) ||
       (local_248.super_buffer<char>.size_ = size, local_248.super_buffer<char>.ptr_ == (char *)0x0)
       ) {
      pbVar14 = (byte *)((long)&local_2d8.prefix + uVar17);
      memset(&local_2d8,0,0x81);
      do {
        *pbVar14 = (byte)out.buffer_ & 1 | 0x30;
        uVar10 = uVar11 << 0x3f;
        pbVar14 = pbVar14 + -1;
        bVar18 = (buffer<char> *)0x1 < out.buffer_;
        bVar19 = uVar11 != 0;
        uVar2 = -uVar11;
        uVar11 = uVar11 >> 1;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 1);
      } while (bVar19 || uVar2 < bVar18);
      copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                ((char *)&local_2d8,(char *)((long)&local_2d8.prefix + uVar17 + 1),
                 &local_248.super_buffer<char>);
    }
    else {
      pcVar7 = local_248.super_buffer<char>.ptr_ + size;
      do {
        pcVar7 = pcVar7 + -1;
        uVar10 = uVar11 << 0x3f;
        *pcVar7 = (byte)out.buffer_ & 1 | 0x30;
        bVar18 = (out.buffer_ < (buffer<char> *)0x2) <= uVar11;
        uVar11 = uVar11 >> 1;
        out.buffer_ = (buffer<char> *)(uVar10 | (ulong)out.buffer_ >> 1);
      } while (bVar18);
    }
    break;
  case '\a':
    local_2d8.prefix = (uint *)((ulong)CONCAT61(local_2d8.prefix._2_6_,(char)out.buffer_) << 8);
    bVar8 = write_padded<char,(fmt::v11::align::type)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_char<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,char,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                      ((basic_appender<char>)this,(format_specs *)grouping,1,1,
                       (anon_class_2_2_bf5026b7 *)&local_2d8);
    goto LAB_00129b60;
  }
  iVar16 = (int)size;
  if (iVar16 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tgsm[P]heliage/dependencies/fmt/include/fmt/base.h"
                ,0x1b1,"negative value");
  }
  if (in_R9[5] != 0) {
    pcVar7 = (char *)*in_R9;
    pcVar12 = pcVar7 + in_R9[1];
    iVar6 = 0;
    iVar15 = 0;
    do {
      if (pcVar7 == pcVar12) {
        cVar13 = pcVar12[-1];
        pcVar7 = pcVar12;
      }
      else {
        cVar13 = *pcVar7;
        if ((byte)(cVar13 + 0x81U) < 0x82) goto LAB_00129b25;
        pcVar7 = pcVar7 + 1;
      }
      iVar15 = iVar15 + cVar13;
      if (iVar16 <= iVar15) goto LAB_00129b25;
      iVar6 = iVar6 + 1;
    } while( true );
  }
  iVar6 = 0;
LAB_00129b25:
  uVar11 = (ulong)(iVar16 + iVar6 + (uVar5 >> 0x18));
  local_2d8.prefix = (uint *)&stack0xfffffffffffffd14;
  local_2d8.buffer = &local_248;
  bVar8 = write_padded<char,(fmt::v11::align::type)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<fmt::v11::basic_appender<char>,unsigned__int128,char>(fmt::v11::basic_appender<char>,unsigned__int128,unsigned_int,fmt::v11::format_specs_const&,fmt::v11::detail::digit_grouping<char>const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                    ((basic_appender<char>)this,(format_specs *)grouping,uVar11,uVar11,&local_2d8);
LAB_00129b60:
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
  return (basic_appender<char>)bVar8.buffer_;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs& specs, const digit_grouping<Char>& grouping)
    -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  default:
    FMT_ASSERT(false, "");
    FMT_FALLTHROUGH;
  case presentation_type::none:
  case presentation_type::dec:
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::hex:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, specs.upper);
    break;
  case presentation_type::oct:
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::bin:
    if (specs.alt)
      prefix_append(prefix, unsigned(specs.upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  case presentation_type::chr:
    return write_char<Char>(out, static_cast<Char>(value), specs);
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<Char, align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}